

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstm.cpp
# Opt level: O2

int __thiscall
ncnn::LSTM::forward(LSTM *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
                   vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint _h;
  int iVar1;
  Mat *bottom_blob;
  Allocator *_allocator;
  Mat *this_00;
  pointer pMVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  uint reverse;
  void *pvVar6;
  int iVar7;
  void *__dest;
  ulong uVar8;
  bool bVar9;
  Mat top_blob_forward;
  Mat cell;
  Mat hidden;
  Mat top_blob_reverse;
  Mat local_228;
  Mat cell1;
  Mat hidden1;
  Mat hidden0;
  Mat local_108;
  Mat local_c0;
  Mat cell0;
  
  bottom_blob = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
  _h = bottom_blob->h;
  iVar1 = this->direction;
  hidden.cstep = 0;
  hidden.data = (void *)0x0;
  hidden.refcount._0_4_ = 0;
  hidden.refcount._4_4_ = 0;
  hidden.elemsize._0_4_ = 0;
  hidden._20_8_ = 0;
  hidden.allocator = (Allocator *)0x0;
  hidden.dims = 0;
  hidden.w = 0;
  hidden.h = 0;
  hidden.d = 0;
  hidden.c = 0;
  cell.cstep = 0;
  cell.data = (void *)0x0;
  cell.refcount._0_4_ = 0;
  cell.refcount._4_4_ = 0;
  cell.elemsize._0_4_ = 0;
  cell._20_8_ = 0;
  cell.allocator = (Allocator *)0x0;
  cell.dims = 0;
  cell.w = 0;
  cell.h = 0;
  cell.d = 0;
  cell.c = 0;
  pvVar6 = (void *)((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                   (long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                         _M_impl.super__Vector_impl_data._M_start);
  _allocator = (&opt->blob_allocator)[pvVar6 != (void *)0xd8];
  lVar5 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)bottom_blob;
  iVar3 = -100;
  if (lVar5 == 0xd8) {
    Mat::clone(&top_blob_forward,(__fn *)(bottom_blob + 1),_allocator,0xd8,pvVar6);
    iVar7 = (int)lVar5;
    Mat::operator=(&hidden,&top_blob_forward);
    Mat::~Mat(&top_blob_forward);
    Mat::clone(&top_blob_forward,
               (__fn *)((bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start + 2),_allocator,iVar7,pvVar6);
    Mat::operator=(&cell,&top_blob_forward);
    Mat::~Mat(&top_blob_forward);
  }
  else {
    iVar7 = (iVar1 == 2) + 1;
    Mat::create(&hidden,this->num_output,iVar7,4,_allocator);
    if ((hidden.data == (void *)0x0) || ((long)hidden.c * hidden.cstep == 0)) goto LAB_001f783c;
    Mat::fill(&hidden,0.0);
    Mat::create(&cell,this->num_output,iVar7,4,_allocator);
    if ((cell.data == (void *)0x0) || ((long)cell.c * cell.cstep == 0)) goto LAB_001f783c;
    Mat::fill(&cell,0.0);
  }
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create(this_00,this->num_output << (iVar1 == 2),_h,4,opt->blob_allocator);
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    reverse = this->direction;
    if (reverse < 2) {
      Mat::channel(&top_blob_forward,&this->weight_xc_data,0);
      Mat::channel(&top_blob_reverse,&this->bias_c_data,0);
      Mat::channel(&hidden0,&this->weight_hc_data,0);
      iVar3 = lstm(bottom_blob,this_00,reverse,&top_blob_forward,&top_blob_reverse,&hidden0,&hidden,
                   &cell,opt);
      Mat::~Mat(&hidden0);
      Mat::~Mat(&top_blob_reverse);
      Mat::~Mat(&top_blob_forward);
      if (iVar3 != 0) goto LAB_001f783c;
      reverse = this->direction;
    }
    if (reverse == 2) {
      Mat::Mat(&top_blob_forward,this->num_output,_h,4,opt->workspace_allocator);
      iVar3 = -100;
      if ((top_blob_forward.data == (void *)0x0) ||
         ((long)top_blob_forward.c * top_blob_forward.cstep == 0)) {
        bVar9 = false;
      }
      else {
        Mat::Mat(&top_blob_reverse,this->num_output,_h,4,opt->workspace_allocator);
        iVar3 = -100;
        if ((top_blob_reverse.data == (void *)0x0) ||
           ((long)top_blob_reverse.c * top_blob_reverse.cstep == 0)) {
          bVar9 = false;
        }
        else {
          Mat::row_range(&hidden0,&hidden,0,1);
          Mat::row_range(&cell0,&cell,0,1);
          Mat::channel(&hidden1,&this->weight_xc_data,0);
          Mat::channel(&cell1,&this->bias_c_data,0);
          Mat::channel(&local_228,&this->weight_hc_data,0);
          iVar3 = lstm(bottom_blob,&top_blob_forward,0,&hidden1,&cell1,&local_228,&hidden0,&cell0,
                       opt);
          Mat::~Mat(&local_228);
          Mat::~Mat(&cell1);
          Mat::~Mat(&hidden1);
          if (iVar3 == 0) {
            Mat::row_range(&hidden1,&hidden,1,1);
            Mat::row_range(&cell1,&cell,1,1);
            Mat::channel(&local_228,&this->weight_xc_data,1);
            Mat::channel(&local_c0,&this->bias_c_data,1);
            Mat::channel(&local_108,&this->weight_hc_data,1);
            iVar3 = lstm(bottom_blob,&top_blob_reverse,1,&local_228,&local_c0,&local_108,&hidden1,
                         &cell1,opt);
            Mat::~Mat(&local_108);
            Mat::~Mat(&local_c0);
            Mat::~Mat(&local_228);
            bVar9 = iVar3 == 0;
            if (bVar9) {
              uVar4 = (ulong)_h;
              if ((int)_h < 1) {
                uVar4 = 0;
              }
              for (uVar8 = 0; iVar3 = 0, uVar4 != uVar8; uVar8 = uVar8 + 1) {
                pvVar6 = (void *)((long)top_blob_reverse.w * uVar8 * top_blob_reverse.elemsize +
                                 (long)top_blob_reverse.data);
                __dest = (void *)((long)this_00->w * uVar8 * this_00->elemsize + (long)this_00->data
                                 );
                memcpy(__dest,(void *)((long)top_blob_forward.w * uVar8 * top_blob_forward.elemsize
                                      + (long)top_blob_forward.data),(long)this->num_output << 2);
                memcpy((void *)((long)__dest + (long)this->num_output * 4),pvVar6,
                       (long)this->num_output << 2);
              }
            }
            Mat::~Mat(&cell1);
            Mat::~Mat(&hidden1);
          }
          else {
            bVar9 = false;
          }
          Mat::~Mat(&cell0);
          Mat::~Mat(&hidden0);
        }
        Mat::~Mat(&top_blob_reverse);
      }
      Mat::~Mat(&top_blob_forward);
      if (!bVar9) goto LAB_001f783c;
    }
    pMVar2 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar3 = 0;
    if ((long)(top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)pMVar2 == 0xd8) {
      Mat::operator=(pMVar2 + 1,&hidden);
      Mat::operator=((top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                     super__Vector_impl_data._M_start + 2,&cell);
      iVar3 = 0;
    }
  }
LAB_001f783c:
  Mat::~Mat(&cell);
  Mat::~Mat(&hidden);
  return iVar3;
}

Assistant:

int LSTM::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int T = bottom_blob.h;
    int num_directions = direction == 2 ? 2 : 1;

    Mat hidden;
    Mat cell;
    Allocator* hidden_cell_allocator = top_blobs.size() == 3 ? opt.blob_allocator : opt.workspace_allocator;
    if (bottom_blobs.size() == 3)
    {
        hidden = bottom_blobs[1].clone(hidden_cell_allocator);
        cell = bottom_blobs[2].clone(hidden_cell_allocator);
    }
    else
    {
        hidden.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (hidden.empty())
            return -100;
        hidden.fill(0.f);

        cell.create(num_output, num_directions, 4u, hidden_cell_allocator);
        if (cell.empty())
            return -100;
        cell.fill(0.f);
    }

    Mat& top_blob = top_blobs[0];
    top_blob.create(num_output * num_directions, T, 4u, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Uni directional
    if (direction == 0 || direction == 1)
    {
        int ret = lstm(bottom_blob, top_blob, direction, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden, cell, opt);
        if (ret != 0)
            return ret;
    }

    if (direction == 2)
    {
        Mat top_blob_forward(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_forward.empty())
            return -100;

        Mat top_blob_reverse(num_output, T, 4u, opt.workspace_allocator);
        if (top_blob_reverse.empty())
            return -100;

        Mat hidden0 = hidden.row_range(0, 1);
        Mat cell0 = cell.row_range(0, 1);
        int ret0 = lstm(bottom_blob, top_blob_forward, 0, weight_xc_data.channel(0), bias_c_data.channel(0), weight_hc_data.channel(0), hidden0, cell0, opt);
        if (ret0 != 0)
            return ret0;

        Mat hidden1 = hidden.row_range(1, 1);
        Mat cell1 = cell.row_range(1, 1);
        int ret1 = lstm(bottom_blob, top_blob_reverse, 1, weight_xc_data.channel(1), bias_c_data.channel(1), weight_hc_data.channel(1), hidden1, cell1, opt);
        if (ret1 != 0)
            return ret1;

        // concat w
        for (int i = 0; i < T; i++)
        {
            const float* pf = top_blob_forward.row(i);
            const float* pr = top_blob_reverse.row(i);
            float* ptr = top_blob.row(i);

            memcpy(ptr, pf, num_output * sizeof(float));
            memcpy(ptr + num_output, pr, num_output * sizeof(float));
        }
    }

    if (top_blobs.size() == 3)
    {
        top_blobs[1] = hidden;
        top_blobs[2] = cell;
    }

    return 0;
}